

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

int gpu_strcasecmp(char *s1,char *s2)

{
  byte *pbVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pbVar1 = (byte *)(s1 + lVar2);
    if (""[*pbVar1] != ""[(byte)s2[lVar2]]) {
      return (uint)""[*pbVar1] - (uint)""[(byte)s2[lVar2]];
    }
    lVar2 = lVar2 + 1;
  } while (*pbVar1 != 0);
  return 0;
}

Assistant:

int gpu_strcasecmp(const char* s1, const char* s2)
{
    unsigned char u1, u2;

    do
    {
        u1 = (unsigned char) *s1++;
        u2 = (unsigned char) *s2++;
        if (caseless_charmap[u1] != caseless_charmap[u2])
            return caseless_charmap[u1] - caseless_charmap[u2];
	} while (u1 != '\0');

    return 0;
}